

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

Own<kj::(anonymous_namespace)::DiskAppendableFile> __thiscall
kj::heap<kj::(anonymous_namespace)::DiskAppendableFile,kj::AutoCloseFd>
          (kj *this,AutoCloseFd *params)

{
  undefined8 *puVar1;
  DiskAppendableFile *extraout_RDX;
  Own<kj::(anonymous_namespace)::DiskAppendableFile> OVar2;
  
  puVar1 = (undefined8 *)operator_new(0x30);
  *puVar1 = &PTR_getFd_0044fc68;
  puVar1[1] = &PTR__AppendableFile_0044fcb8;
  anon_unknown_8::DiskHandle::DiskHandle((DiskHandle *)(puVar1 + 2),params);
  *puVar1 = &PTR_getFd_0044f270;
  puVar1[1] = &DAT_0044f2d0;
  puVar1[3] = &DAT_0044f300;
  FdOutputStream::FdOutputStream((FdOutputStream *)(puVar1 + 3),*(int *)(puVar1 + 2));
  *puVar1 = &PTR_getFd_0044f270;
  puVar1[1] = &DAT_0044f2d0;
  puVar1[3] = &DAT_0044f300;
  *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::DiskAppendableFile>::instance;
  *(undefined8 **)(this + 8) = puVar1;
  OVar2.ptr = extraout_RDX;
  OVar2.disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::DiskAppendableFile>::instance;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}